

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int smem_create(char *filename,int *driverhandle)

{
  int iVar1;
  int nitems;
  int sz;
  int h;
  DAL_SHM_SEGHEAD *sp;
  int *driverhandle_local;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local._4_4_ = 0x98;
  }
  else if (driverhandle == (int *)0x0) {
    filename_local._4_4_ = 0x98;
  }
  else {
    sp = (DAL_SHM_SEGHEAD *)driverhandle;
    driverhandle_local = (int *)filename;
    iVar1 = __isoc99_sscanf(filename,"h%d",&nitems);
    if (iVar1 == 1) {
      nitems = shared_malloc(0xb50,0xc,nitems);
      if (nitems == -1) {
        filename_local._4_4_ = 0x9c;
      }
      else {
        _sz = (undefined4 *)shared_lock(nitems,1);
        if (_sz == (undefined4 *)0x0) {
          shared_free(nitems);
          filename_local._4_4_ = 0x97;
        }
        else {
          *_sz = 0x19630114;
          _sz[1] = nitems;
          _sz[2] = 0xb50;
          _sz[3] = 0xffffffff;
          sp->ID = nitems;
          filename_local._4_4_ = 0;
        }
      }
    }
    else {
      filename_local._4_4_ = 0x97;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int     smem_create(char *filename, int *driverhandle)
 { DAL_SHM_SEGHEAD *sp;
   int h, sz, nitems;

   if (NULL == filename) return(SHARED_NULPTR);         /* currently ignored */
   if (NULL == driverhandle) return(SHARED_NULPTR);
   nitems = sscanf(filename, "h%d", &h);
   if (1 != nitems) return(SHARED_BADARG);

   if (SHARED_INVALID == (h = shared_malloc(sz = 2880 + sizeof(DAL_SHM_SEGHEAD), 
                        SHARED_RESIZE | SHARED_PERSIST, h)))
     return(SHARED_NOMEM);

   if (NULL == (sp = (DAL_SHM_SEGHEAD *)shared_lock(h, SHARED_RDWRITE)))
     { shared_free(h);
       return(SHARED_BADARG);
     }

   sp->ID = DAL_SHM_SEGHEAD_ID;
   sp->h = h;
   sp->size = sz;
   sp->nodeidx = -1;

   *driverhandle = h;
   
   return(0);
 }